

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> * __thiscall
amrex::BoxArray::intersections
          (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
           *__return_storage_ptr__,BoxArray *this,Box *bx)

{
  IntVect local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20.vect[0] = 0;
  local_20.vect[1] = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20.vect[2] = 0;
  intersections(this,bx,__return_storage_ptr__,false,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::pair<int,Box> >
BoxArray::intersections (const Box& bx) const
{
    std::vector< std::pair<int,Box> > isects;
    intersections(bx,isects,false,IntVect::TheZeroVector());
    return isects;
}